

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

uint32_t binary_fuse16_hash(uint64_t index,uint64_t hash,binary_fuse16_t *filter)

{
  uint64_t uVar1;
  long in_RDX;
  uint64_t in_RSI;
  int in_EDI;
  uint64_t hh;
  uint64_t h;
  
  uVar1 = binary_fuse_mulhi(in_RSI,(ulong)*(uint *)(in_RDX + 0x18));
  return (uint)((in_RSI & 0xfffffffff) >> ((char)in_EDI * -0x12 + 0x24U & 0x3f)) &
         *(uint *)(in_RDX + 0x10) ^ in_EDI * *(int *)(in_RDX + 0xc) + (int)uVar1;
}

Assistant:

static inline uint32_t binary_fuse16_hash(uint64_t index, uint64_t hash,
                                        const binary_fuse16_t *filter) {
    uint64_t h = binary_fuse_mulhi(hash, filter->SegmentCountLength);
    h += index * filter->SegmentLength;
    // keep the lower 36 bits
    uint64_t hh = hash & ((1ULL << 36U) - 1);
    // index 0: right shift by 36; index 1: right shift by 18; index 2: no shift
    h ^= (size_t)((hh >> (36 - 18 * index)) & filter->SegmentLengthMask);
    return (uint32_t)h;
}